

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O0

Comment * soul::getComment(Comment *__return_storage_ptr__,Context *context)

{
  CodeLocation local_28;
  Context *local_18;
  Context *context_local;
  
  local_18 = context;
  context_local = (Context *)__return_storage_ptr__;
  CodeLocation::CodeLocation(&local_28,&context->location);
  SourceCodeUtilities::findPrecedingComment(__return_storage_ptr__,&local_28);
  CodeLocation::~CodeLocation(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static SourceCodeUtilities::Comment getComment (const AST::Context& context)
{
    return SourceCodeUtilities::findPrecedingComment (context.location);
}